

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuThreadUtil.cpp
# Opt level: O0

int __thiscall tcu::ThreadUtil::Thread::getMessageCount(Thread *this)

{
  size_type sVar1;
  ScopedLock local_18;
  ScopedLock lock;
  Thread *this_local;
  
  lock.m_mutex = (Mutex *)this;
  de::ScopedLock::ScopedLock(&local_18,&this->m_messageLock);
  sVar1 = std::vector<tcu::ThreadUtil::Message,_std::allocator<tcu::ThreadUtil::Message>_>::size
                    (&this->m_messages);
  de::ScopedLock::~ScopedLock(&local_18);
  return (int)sVar1;
}

Assistant:

int Thread::getMessageCount	 (void) const
{
	de::ScopedLock lock(m_messageLock);
	return (int)(m_messages.size());
}